

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1gload.c
# Opt level: O1

FT_Error T1_Get_Advances(FT_Face t1face,FT_UInt first,FT_UInt count,FT_Int32 load_flags,
                        FT_Fixed *advances)

{
  int iVar1;
  FT_Error FVar2;
  FT_Fixed FVar3;
  long lVar4;
  ulong uVar5;
  T1_DecoderRec decoder;
  
  if ((load_flags & 0x10U) == 0) {
    iVar1 = (*(code *)**(undefined8 **)(t1face[3].family_name + 0x18))
                      (&decoder,t1face,0,0,t1face[2].glyph,t1face[3].bbox.xMin,0,0,T1_Parse_Glyph);
    if (iVar1 != 0) {
      return iVar1;
    }
    decoder.builder.metrics_only = '\x01';
    decoder.builder.load_points = '\0';
    decoder.num_subrs = (FT_Int)t1face[2].bbox.yMin;
    decoder.subrs = (FT_Byte **)t1face[2].bbox.xMax;
    decoder.subrs_len = (FT_UInt *)t1face[2].bbox.yMax;
    decoder.subrs_hash = *(FT_Hash *)&t1face[2].units_per_EM;
    decoder.buildchar = (FT_Long *)t1face[3].bbox.yMax;
    decoder.len_buildchar = (FT_UInt)t1face[3].bbox.xMax;
    if (count == 0) {
      return 0;
    }
    uVar5 = 0;
    do {
      FVar2 = T1_Parse_Glyph(&decoder,first + (int)uVar5);
      if (FVar2 == 0) {
        FVar3 = FT_RoundFix(decoder.builder.advance.x);
        lVar4 = FVar3 >> 0x10;
      }
      else {
        lVar4 = 0;
      }
      advances[uVar5] = lVar4;
      uVar5 = uVar5 + 1;
    } while (count != uVar5);
  }
  else if (count != 0) {
    memset(advances,0,(ulong)count << 3);
    return 0;
  }
  return 0;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  T1_Get_Advances( FT_Face    t1face,        /* T1_Face */
                   FT_UInt    first,
                   FT_UInt    count,
                   FT_Int32   load_flags,
                   FT_Fixed*  advances )
  {
    T1_Face        face  = (T1_Face)t1face;
    T1_DecoderRec  decoder;
    T1_Font        type1 = &face->type1;
    PSAux_Service  psaux = (PSAux_Service)face->psaux;
    FT_UInt        nn;
    FT_Error       error;


    if ( load_flags & FT_LOAD_VERTICAL_LAYOUT )
    {
      for ( nn = 0; nn < count; nn++ )
        advances[nn] = 0;

      return FT_Err_Ok;
    }

    error = psaux->t1_decoder_funcs->init( &decoder,
                                           (FT_Face)face,
                                           0, /* size       */
                                           0, /* glyph slot */
                                           (FT_Byte**)type1->glyph_names,
                                           face->blend,
                                           0,
                                           FT_RENDER_MODE_NORMAL,
                                           T1_Parse_Glyph );
    if ( error )
      return error;

    decoder.builder.metrics_only = 1;
    decoder.builder.load_points  = 0;

    decoder.num_subrs  = type1->num_subrs;
    decoder.subrs      = type1->subrs;
    decoder.subrs_len  = type1->subrs_len;
    decoder.subrs_hash = type1->subrs_hash;

    decoder.buildchar     = face->buildchar;
    decoder.len_buildchar = face->len_buildchar;

    for ( nn = 0; nn < count; nn++ )
    {
      error = T1_Parse_Glyph( &decoder, first + nn );
      if ( !error )
        advances[nn] = FIXED_TO_INT( decoder.builder.advance.x );
      else
        advances[nn] = 0;
    }

    return FT_Err_Ok;
  }